

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
                 *this,GetterXsYs<unsigned_long_long> *getter1,
                GetterXsYRef<unsigned_long_long> *getter2,TransformerLogLin *transformer,ImU32 col)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  double dVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  GetterXsYRef<unsigned_long_long> *pGVar6;
  TransformerLogLin *pTVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  long lVar14;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar4 = getter1->Count;
  iVar13 = getter2->Count;
  if (iVar4 < getter2->Count) {
    iVar13 = iVar4;
  }
  this->Prims = iVar13 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar12 = GImPlot;
  (this->P12).y = 0.0;
  lVar14 = (long)((getter1->Offset % iVar4 + iVar4) % iVar4) * (long)getter1->Stride;
  uVar1 = *(unsigned_long_long *)((long)getter1->Xs + lVar14);
  uVar2 = *(unsigned_long_long *)((long)getter1->Ys + lVar14);
  dVar10 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar5 = pIVar12->CurrentPlot;
  dVar3 = (pIVar5->XAxis).Range.Min;
  iVar4 = transformer->YAxis;
  IVar8.y = (float)(((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                    pIVar5->YAxis[iVar4].Range.Min) * pIVar12->My[iVar4] +
                   (double)pIVar12->PixelRange[iVar4].Min.y);
  IVar8.x = (float)((((double)(float)(dVar10 / pIVar12->LogDenX) *
                      ((pIVar5->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar12->Mx +
                   (double)pIVar12->PixelRange[iVar4].Min.x);
  this->P11 = IVar8;
  pIVar12 = GImPlot;
  pGVar6 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar4 = pGVar6->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar6->Xs +
           (long)((pGVar6->Offset % iVar4 + iVar4) % iVar4) * (long)pGVar6->Stride);
  dVar3 = pGVar6->YRef;
  dVar11 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar5 = pIVar12->CurrentPlot;
  dVar10 = (pIVar5->XAxis).Range.Min;
  iVar4 = pTVar7->YAxis;
  IVar9.y = (float)((dVar3 - pIVar5->YAxis[iVar4].Range.Min) * pIVar12->My[iVar4] +
                   (double)pIVar12->PixelRange[iVar4].Min.y);
  IVar9.x = (float)((((double)(float)(dVar11 / pIVar12->LogDenX) *
                      ((pIVar5->XAxis).Range.Max - dVar10) + dVar10) - dVar10) * pIVar12->Mx +
                   (double)pIVar12->PixelRange[iVar4].Min.x);
  this->P12 = IVar9;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }